

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

void Am_Pop_Up_Generalize_DB(Am_Object *script_window,Am_Value_List *sel_list)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  Am_Value *pAVar4;
  ostream *poVar5;
  Am_Object main_script_line_part;
  Am_Value value;
  Am_Object obj;
  Am_Object local_2a0;
  Am_Object local_298;
  ostrstream oss;
  char line [250];
  
  Am_Value_List::Start(sel_list);
  pAVar4 = Am_Value_List::Get(sel_list);
  Am_Object::Am_Object(&main_script_line_part,pAVar4);
  pAVar4 = Am_Object::Get(&main_script_line_part,0xb8,0);
  uVar3 = Am_Value::operator_cast_to_int(pAVar4);
  if (am_sdebug == true) {
    poVar5 = std::operator<<((ostream *)&std::cout,"sel ");
    poVar5 = operator<<(poVar5,&main_script_line_part);
    poVar5 = std::operator<<(poVar5," slot ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ushort)uVar3);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ostream::flush();
  }
  if ((uVar3 & 0xffff) == 0x16d) {
    popup_generalize_script_objects(&main_script_line_part,script_window,sel_list);
    goto LAB_00203385;
  }
  pAVar4 = Am_Object::Get(&main_script_line_part,0x169,0);
  Am_Value::Am_Value(&value,pAVar4);
  if (am_sdebug == true) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Value for value is ");
    poVar5 = operator<<(poVar5,&value);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ostream::flush();
  }
  bVar1 = Am_Inter_Location::Test(&value);
  if (bVar1) {
LAB_0020336b:
    popup_generalize_script_location(&main_script_line_part,script_window,sel_list);
  }
  else {
    if (value.type == 0xa001) {
      Am_Object::Am_Object((Am_Object *)&oss,&value);
      Am_Object::Am_Object(&local_298,&Am_Inter_Location_Placeholder);
      bVar1 = Am_Object::Is_Instance_Of((Am_Object *)&oss,&local_298);
      Am_Object::~Am_Object(&local_298);
      Am_Object::~Am_Object((Am_Object *)&oss);
      if (bVar1) goto LAB_0020336b;
    }
    bVar1 = Am_Value_List::Test(&value);
    if (bVar1) {
      Am_Value_List::Am_Value_List((Am_Value_List *)&oss,&value);
      uVar2 = Am_Value_List::Length((Am_Value_List *)&oss);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&oss);
      if (1 < uVar2) {
        std::ostrstream::ostrstream(&oss,line,0xfa,_S_out);
        poVar5 = std::operator<<((ostream *)&oss,
                                 "Generalizing on List of Values not yet implemented.  Select one value in list."
                                );
        std::ends<char,std::char_traits<char>>(poVar5);
        Am_Pop_Up_Error_Window(line);
        std::ostrstream::~ostrstream(&oss);
        goto LAB_0020337b;
      }
    }
    if (value.type == 0xa001) {
      Am_Object::Am_Object(&obj,&value);
      Am_Object::Am_Object(&local_2a0,&Am_A_Placeholder);
      bVar1 = Am_Object::Is_Instance_Of(&obj,&local_2a0);
      Am_Object::~Am_Object(&local_2a0);
      if (bVar1) {
        pAVar4 = Am_Object::Get(&obj,0x169,0);
        Am_Value::Am_Value((Am_Value *)&oss,pAVar4);
        poVar5 = std::operator<<((ostream *)&std::cout,"for placeholder ");
        poVar5 = operator<<(poVar5,&obj);
        poVar5 = std::operator<<(poVar5," found old val ");
        poVar5 = operator<<(poVar5,(Am_Value *)&oss);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::ostream::flush();
        if (_oss == 0xa001) {
          popup_generalize_script_objects(&main_script_line_part,script_window,sel_list);
        }
        else {
          popup_generalize_script_value(&value,&main_script_line_part,script_window,sel_list);
        }
        Am_Value::~Am_Value((Am_Value *)&oss);
      }
      else if ((uVar3 & 0xffff) == 0x169) {
        std::ostrstream::ostrstream(&oss,line,0xfa,_S_out);
        poVar5 = std::operator<<((ostream *)&oss,
                                 "Can\'t generalize on Objects returned from commands.");
        std::ends<char,std::char_traits<char>>(poVar5);
        Am_Pop_Up_Error_Window(line);
        std::ostrstream::~ostrstream(&oss);
      }
      else {
        popup_generalize_script_objects(&main_script_line_part,script_window,sel_list);
      }
      Am_Object::~Am_Object(&obj);
    }
    else {
      popup_generalize_script_value(&value,&main_script_line_part,script_window,sel_list);
    }
  }
LAB_0020337b:
  Am_Value::~Am_Value(&value);
LAB_00203385:
  Am_Object::~Am_Object(&main_script_line_part);
  return;
}

Assistant:

void
Am_Pop_Up_Generalize_DB(Am_Object &script_window, Am_Value_List &sel_list)
{
  sel_list.Start();
  Am_Object main_script_line_part = sel_list.Get();
  Am_Slot_Key key =
      (Am_Slot_Key)(int)main_script_line_part.Get(Am_SLOTS_TO_SAVE);
  if (am_sdebug)
    std::cout << "sel " << main_script_line_part << " slot " << key << std::endl
              << std::flush;
  if (key == Am_OBJECT_MODIFIED) {
    popup_generalize_script_objects(main_script_line_part, script_window,
                                    sel_list);
  } else { //not object modified
    Am_Value value = main_script_line_part.Get(Am_VALUE);
    if (am_sdebug)
      std::cout << "Value for value is " << value << std::endl << std::flush;
    if (Am_Inter_Location::Test(value) ||
        (value.type == Am_OBJECT &&
         Am_Object(value).Is_Instance_Of(Am_Inter_Location_Placeholder))) {
      popup_generalize_script_location(main_script_line_part, script_window,
                                       sel_list);
    } else if (Am_Value_List::Test(value) &&
               Am_Value_List(value).Length() > 1) {
      AM_POP_UP_ERROR_WINDOW("Generalizing on List of Values not yet "
                             "implemented.  Select one value in list.");
    } else if (value.type == Am_OBJECT) {
      Am_Object obj = value;
      if (!obj.Is_Instance_Of(Am_A_Placeholder)) {
        // not a placeholder
        if (key == Am_VALUE) {
          AM_POP_UP_ERROR_WINDOW(
              "Can't generalize on Objects returned from commands.");
        } else
          popup_generalize_script_objects(main_script_line_part, script_window,
                                          sel_list);
      } else { //is a placeholder
        Am_Value old_val = obj.Get(Am_VALUE);
        std::cout << "for placeholder " << obj << " found old val " << old_val
                  << std::endl
                  << std::flush;
        if (old_val.type == Am_OBJECT)
          popup_generalize_script_objects(main_script_line_part, script_window,
                                          sel_list);
        else
          popup_generalize_script_value(value, main_script_line_part,
                                        script_window, sel_list);
      }
    } else // not an object
      popup_generalize_script_value(value, main_script_line_part, script_window,
                                    sel_list);
  }
}